

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPetNet.cpp
# Opt level: O0

void __thiscall NaPetriNet::terminate(NaPetriNet *this,bool bDoPrintouts)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  NaPetriNode **ppNVar4;
  NaPetriConnector *pNVar5;
  byte in_SIL;
  NaPetriNet *in_RDI;
  sigaction sa_old;
  sigaction sa;
  NaException exCode_1;
  int iCn;
  NaException exCode;
  int iNode;
  undefined8 in_stack_fffffffffffffdf8;
  undefined4 in_stack_fffffffffffffe00;
  undefined4 in_stack_fffffffffffffe04;
  int iVar6;
  _union_1457 local_c0 [19];
  int local_24;
  int local_10;
  byte local_9;
  
  local_9 = in_SIL & 1;
  if ((in_RDI->bTermPrintout & 1U) != 0) {
    local_9 = in_RDI->bTermPrintout & 1;
  }
  if (local_9 != 0) {
    pcVar3 = name(in_RDI);
    NaPrintLog("# net \'%s\', obtain statistics:\n",pcVar3);
    local_10 = 0;
    while( true ) {
      iVar6 = local_10;
      iVar2 = NaDynAr<NaPetriNode_*>::count(&in_RDI->pnaNet);
      if (iVar2 <= iVar6) break;
      ppNVar4 = NaDynAr<NaPetriNode_*>::operator[]
                          ((NaDynAr<NaPetriNode_*> *)
                           CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                           (int)((ulong)in_stack_fffffffffffffdf8 >> 0x20));
      pcVar3 = NaPetriNode::name(*ppNVar4);
      ppNVar4 = NaDynAr<NaPetriNode_*>::operator[]
                          ((NaDynAr<NaPetriNode_*> *)
                           CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                           (int)((ulong)in_stack_fffffffffffffdf8 >> 0x20));
      uVar1 = (*ppNVar4)->nCalls;
      ppNVar4 = NaDynAr<NaPetriNode_*>::operator[]
                          ((NaDynAr<NaPetriNode_*> *)
                           CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                           (int)((ulong)in_stack_fffffffffffffdf8 >> 0x20));
      NaPrintLog(" * node \'%s\' was called %u times and %u times was activated.\n",pcVar3,
                 (ulong)uVar1,(ulong)(*ppNVar4)->nActivations);
      local_10 = local_10 + 1;
    }
    pcVar3 = name(in_RDI);
    NaPrintLog("# net \'%s\', phase #10: deallocation and closing data.\n",pcVar3);
  }
  local_10 = 0;
  while( true ) {
    iVar6 = local_10;
    iVar2 = NaDynAr<NaPetriNode_*>::count(&in_RDI->pnaNet);
    if (iVar2 <= iVar6) break;
    if ((local_9 & 1) != 0) {
      ppNVar4 = NaDynAr<NaPetriNode_*>::operator[]
                          ((NaDynAr<NaPetriNode_*> *)
                           CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                           (int)((ulong)in_stack_fffffffffffffdf8 >> 0x20));
      pcVar3 = NaPetriNode::name(*ppNVar4);
      NaPrintLog("node \'%s\'\n",pcVar3);
    }
    ppNVar4 = NaDynAr<NaPetriNode_*>::operator[]
                        ((NaDynAr<NaPetriNode_*> *)
                         CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                         (int)((ulong)in_stack_fffffffffffffdf8 >> 0x20));
    (*(*ppNVar4)->_vptr_NaPetriNode[0x14])();
    local_10 = local_10 + 1;
  }
  local_10 = 0;
  while( true ) {
    iVar6 = local_10;
    iVar2 = NaDynAr<NaPetriNode_*>::count(&in_RDI->pnaNet);
    if (iVar2 <= iVar6) break;
    local_24 = 0;
    while( true ) {
      iVar6 = local_24;
      NaDynAr<NaPetriNode_*>::operator[]
                ((NaDynAr<NaPetriNode_*> *)
                 CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                 (int)((ulong)in_stack_fffffffffffffdf8 >> 0x20));
      iVar2 = NaPetriNode::connectors((NaPetriNode *)0x15aef5);
      if (iVar2 <= iVar6) break;
      NaDynAr<NaPetriNode_*>::operator[]
                ((NaDynAr<NaPetriNode_*> *)
                 CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                 (int)((ulong)in_stack_fffffffffffffdf8 >> 0x20));
      pNVar5 = NaPetriNode::connector
                         ((NaPetriNode *)
                          CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                          (int)((ulong)in_stack_fffffffffffffdf8 >> 0x20));
      (*pNVar5->_vptr_NaPetriConnector[6])();
      local_24 = local_24 + 1;
    }
    local_10 = local_10 + 1;
  }
  local_10 = 0;
  while( true ) {
    iVar6 = local_10;
    iVar2 = NaDynAr<NaPetriNode_*>::count(&in_RDI->pnaNet);
    if (iVar2 <= iVar6) break;
    ppNVar4 = NaDynAr<NaPetriNode_*>::operator[]
                        ((NaDynAr<NaPetriNode_*> *)CONCAT44(iVar6,in_stack_fffffffffffffe00),
                         (int)((ulong)in_stack_fffffffffffffdf8 >> 0x20));
    (*ppNVar4)->bTunable = true;
    local_10 = local_10 + 1;
  }
  if (in_RDI->dfTimeChart != (NaDataFile *)0x0) {
    if (in_RDI->dfTimeChart != (NaDataFile *)0x0) {
      (*in_RDI->dfTimeChart->_vptr_NaDataFile[1])();
    }
    in_RDI->dfTimeChart = (NaDataFile *)0x0;
  }
  local_c0[0].sa_handler = (__sighandler_t)0x0;
  sigaction(2,(sigaction *)local_c0,(sigaction *)&stack0xfffffffffffffea8);
  sigaction(0xf,(sigaction *)local_c0,(sigaction *)&stack0xfffffffffffffea8);
  sigaction(3,(sigaction *)local_c0,(sigaction *)&stack0xfffffffffffffea8);
  if (in_RDI->fpMap != (FILE *)0x0) {
    fclose((FILE *)in_RDI->fpMap);
    in_RDI->fpMap = (FILE *)0x0;
  }
  return;
}

Assistant:

void
NaPetriNet::terminate (bool bDoPrintouts)
{
    int     iNode;

    if(bTermPrintout)
      bDoPrintouts = bTermPrintout;

    if(bDoPrintouts){
      // Get statistics from each node
      NaPrintLog("# net '%s', obtain statistics:\n", name());
      for(iNode = 0; iNode < pnaNet.count(); ++iNode){
	NaPrintLog(" * node '%s' was called %u times and %u times "\
		   "was activated.\n",
		   pnaNet[iNode]->name(),
		   pnaNet[iNode]->nCalls,
		   pnaNet[iNode]->nActivations);
      }

      NaPrintLog("# net '%s', phase #10: deallocation and closing data.\n",
		 name());
    }

    // 10. Deallocate resources and close external data
    for(iNode = 0; iNode < pnaNet.count(); ++iNode){
        try{
            if(bDoPrintouts){
		NaPrintLog("node '%s'\n", pnaNet[iNode]->name());
            }
            pnaNet[iNode]->release_and_close();
        }catch(NaException exCode){
            NaPrintLog("Deallocate resources phase (#10): node '%s' fault.\n"
                       "Caused by exception: %s\n",
                       pnaNet[iNode]->name(), NaExceptionMsg(exCode));
        }
    }

    // Call final() for each connector
    for(iNode = 0; iNode < pnaNet.count(); ++iNode){
        // Need to shutdown connections
        int iCn;
        for(iCn = 0; iCn < pnaNet[iNode]->connectors(); ++iCn){
	  try{
            pnaNet[iNode]->connector(iCn)->final();
	  }catch(NaException exCode){
            NaPrintLog("Failure at %s.%s.%s.final().\n"
                       "Caused by exception: %s\n",
		       name(), pnaNet[iNode]->name(),
		       pnaNet[iNode]->connector(iCn)->name(),
		       NaExceptionMsg(exCode));
	  }
        }
    }

    // Allow changes of node parameters
    for(iNode = 0; iNode < pnaNet.count(); ++iNode){
        pnaNet[iNode]->bTunable = true;
    }

    if(NULL != dfTimeChart){
        delete dfTimeChart;
        dfTimeChart = NULL;
    }

#if defined(unix)
    // Reset the signal handler
    struct sigaction	sa, sa_old;
    sa.sa_handler = SIG_DFL;
    sigaction(SIGINT, &sa, &sa_old);
    sigaction(SIGTERM, &sa, &sa_old);
    sigaction(SIGQUIT, &sa, &sa_old);
#endif /* unix */

    /* Close activation map file */
    if(NULL != fpMap)
      {
	fclose(fpMap);
	fpMap = NULL;
      }
}